

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5DlidxLvlPrev(Fts5DlidxLvl *pLvl)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int local_40;
  int local_3c;
  int j;
  int bZero;
  int nZero;
  int ii;
  int iLimit;
  i64 iVal;
  u8 *a;
  Fts5DlidxLvl *pFStack_10;
  int iOff;
  Fts5DlidxLvl *pLvl_local;
  
  iVar1 = pLvl->iOff;
  pFStack_10 = pLvl;
  if (pLvl->iFirstOff < iVar1) {
    iVal = (i64)pLvl->pData->p;
    j = 0;
    if (iVar1 < 10) {
      local_40 = 0;
    }
    else {
      local_40 = iVar1 + -9;
    }
    do {
      a._4_4_ = iVar1 + -1;
      if (a._4_4_ <= local_40) break;
      iVar2 = iVar1 + -2;
      iVar1 = a._4_4_;
    } while ((*(byte *)(iVal + iVar2) & 0x80) != 0);
    sqlite3Fts5GetVarint((uchar *)(iVal + a._4_4_),(u64 *)&ii);
    pFStack_10->iRowid = pFStack_10->iRowid - _ii;
    pFStack_10->iLeafPgno = pFStack_10->iLeafPgno + -1;
    iVar1 = a._4_4_;
    while( true ) {
      bZero = iVar1 + -1;
      bVar3 = false;
      if (pFStack_10->iFirstOff <= bZero) {
        bVar3 = *(char *)(iVal + bZero) == '\0';
      }
      if (!bVar3) break;
      j = j + 1;
      iVar1 = bZero;
    }
    if ((pFStack_10->iFirstOff <= bZero) && ((*(byte *)(iVal + bZero) & 0x80) != 0)) {
      bVar3 = false;
      if (pFStack_10->iFirstOff <= iVar1 + -9) {
        local_3c = 1;
        while( true ) {
          bVar3 = false;
          if (local_3c < 9) {
            bVar3 = (*(byte *)(iVal + (bZero - local_3c)) & 0x80) != 0;
          }
          if (!bVar3) break;
          local_3c = local_3c + 1;
        }
        bVar3 = 8 < local_3c;
      }
      if (!bVar3) {
        j = j + -1;
      }
    }
    pFStack_10->iLeafPgno = pFStack_10->iLeafPgno - j;
    pFStack_10->iOff = a._4_4_ - j;
  }
  else {
    pLvl->bEof = 1;
  }
  return pFStack_10->bEof;
}

Assistant:

static int fts5DlidxLvlPrev(Fts5DlidxLvl *pLvl){
  int iOff = pLvl->iOff;

  assert( pLvl->bEof==0 );
  if( iOff<=pLvl->iFirstOff ){
    pLvl->bEof = 1;
  }else{
    u8 *a = pLvl->pData->p;
    i64 iVal;
    int iLimit;
    int ii;
    int nZero = 0;

    /* Currently iOff points to the first byte of a varint. This block 
    ** decrements iOff until it points to the first byte of the previous 
    ** varint. Taking care not to read any memory locations that occur
    ** before the buffer in memory.  */
    iLimit = (iOff>9 ? iOff-9 : 0);
    for(iOff--; iOff>iLimit; iOff--){
      if( (a[iOff-1] & 0x80)==0 ) break;
    }

    fts5GetVarint(&a[iOff], (u64*)&iVal);
    pLvl->iRowid -= iVal;
    pLvl->iLeafPgno--;

    /* Skip backwards past any 0x00 varints. */
    for(ii=iOff-1; ii>=pLvl->iFirstOff && a[ii]==0x00; ii--){
      nZero++;
    }
    if( ii>=pLvl->iFirstOff && (a[ii] & 0x80) ){
      /* The byte immediately before the last 0x00 byte has the 0x80 bit
      ** set. So the last 0x00 is only a varint 0 if there are 8 more 0x80
      ** bytes before a[ii]. */
      int bZero = 0;              /* True if last 0x00 counts */
      if( (ii-8)>=pLvl->iFirstOff ){
        int j;
        for(j=1; j<=8 && (a[ii-j] & 0x80); j++);
        bZero = (j>8);
      }
      if( bZero==0 ) nZero--;
    }
    pLvl->iLeafPgno -= nZero;
    pLvl->iOff = iOff - nZero;
  }

  return pLvl->bEof;
}